

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void int16_suite::run(void)

{
  test_zero();
  test_one();
  test_endian();
  test_minus_one();
  test_max();
  test_min();
  fail_missing_one();
  fail_missing_two();
  return;
}

Assistant:

void run()
{
    test_zero();
    test_one();
    test_endian();
    test_minus_one();
    test_max();
    test_min();
    fail_missing_one();
    fail_missing_two();
}